

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O0

void __thiscall
pzgeom::TPZQuadTorus::X<double>
          (TPZQuadTorus *this,TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  double *pdVar2;
  TPZVec<double> *in_RCX;
  long in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  TPZManVector<double,_2> *this_00;
  TPZManVector<double,_2> resloc;
  int64_t in_stack_ffffffffffffff18;
  TPZManVector<double,_2> *in_stack_ffffffffffffff20;
  TPZVec<double> local_50;
  TPZVec<double> *local_20;
  
  local_20 = in_RCX;
  TPZManVector<double,_2>::TPZManVector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZGeoQuad::X<double>
            ((TPZFMatrix<double> *)resloc.fExtAlloc[1],(TPZVec<double> *)resloc.fExtAlloc[0],
             (TPZVec<double> *)resloc.super_TPZVec<double>.fNAlloc);
  dVar1 = *(double *)(in_RDI + 0x28);
  dVar5 = *(double *)(in_RDI + 0x30);
  pdVar2 = TPZVec<double>::operator[](&local_50,0);
  dVar3 = cos(*pdVar2);
  pdVar2 = TPZVec<double>::operator[](&local_50,1);
  dVar4 = cos(*pdVar2);
  pdVar2 = TPZVec<double>::operator[](local_20,0);
  *pdVar2 = (dVar5 * dVar3 + dVar1) * dVar4;
  dVar1 = *(double *)(in_RDI + 0x28);
  dVar5 = *(double *)(in_RDI + 0x30);
  pdVar2 = TPZVec<double>::operator[](&local_50,0);
  dVar3 = cos(*pdVar2);
  pdVar2 = TPZVec<double>::operator[](&local_50,1);
  dVar4 = sin(*pdVar2);
  dVar4 = (dVar5 * dVar3 + dVar1) * dVar4;
  pdVar2 = TPZVec<double>::operator[](local_20,1);
  *pdVar2 = dVar4;
  dVar1 = *(double *)(in_RDI + 0x30);
  pdVar2 = TPZVec<double>::operator[](&local_50,0);
  dVar5 = sin(*pdVar2);
  this_00 = (TPZManVector<double,_2> *)(dVar1 * dVar5);
  pdVar2 = TPZVec<double>::operator[](local_20,2);
  *pdVar2 = (double)this_00;
  TPZManVector<double,_2>::~TPZManVector(this_00);
  return;
}

Assistant:

void X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            TPZManVector<T,2> resloc(2);
            TPZGeoQuad::X(this->fPhiTheta,loc,resloc);
            
            result[0] = (fR + fr*cos(resloc[0]))*cos(resloc[1]);
            result[1] = (fR + fr*cos(resloc[0]))*sin(resloc[1]);
            result[2] = fr*sin(resloc[0]);
            
        }